

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b_compress(blake2b_state *S,uint8_t *block)

{
  uint64_t uVar1;
  long in_RSI;
  long in_RDI;
  int i;
  uint64_t v [16];
  uint64_t m [16];
  int local_11c;
  ulong local_118 [8];
  ulong local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint64_t auStack_98 [4];
  long lStack_78;
  long lStack_70;
  long lStack_68;
  long lStack_60;
  long lStack_58;
  long lStack_50;
  long lStack_48;
  long lStack_40;
  long lStack_38;
  long lStack_30;
  long lStack_28;
  long lStack_20;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_11c = 0; local_11c < 0x10; local_11c = local_11c + 1) {
    uVar1 = load64((void *)(local_10 + (long)local_11c * 8));
    auStack_98[local_11c] = uVar1;
  }
  for (local_11c = 0; local_11c < 8; local_11c = local_11c + 1) {
    local_118[local_11c] = *(ulong *)(local_8 + (long)local_11c * 8);
  }
  local_d8 = 0x6a09e667f3bcc908;
  local_d0 = 0xbb67ae8584caa73b;
  local_c8 = 0x3c6ef372fe94f82b;
  local_c0 = 0xa54ff53a5f1d36f1;
  local_b8 = *(ulong *)(local_8 + 0x40) ^ 0x510e527fade682d1;
  local_b0 = *(ulong *)(local_8 + 0x48) ^ 0x9b05688c2b3e6c1f;
  local_a8 = *(ulong *)(local_8 + 0x50) ^ 0x1f83d9abfb41bd6b;
  local_a0 = *(ulong *)(local_8 + 0x58) ^ 0x5be0cd19137e2179;
  local_118[0] = local_118[0] + local_118[4] + auStack_98[0];
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + auStack_98[1];
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[2];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[3];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_78;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_70;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_60;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_58;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_48;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_40;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_38;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_30;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_28;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_20;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_28;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_48;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_78;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_58;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_50;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_20;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_30;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + auStack_98[1];
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_38;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + auStack_98[0];
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + auStack_98[2];
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_40;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_60;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_70;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + auStack_98[3];
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_40;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_58;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_38;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[0];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_70;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + auStack_98[2];
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_20;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_30;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_28;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + auStack_98[3];
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_68;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_60;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + auStack_98[1];
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_50;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_78;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_60;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_50;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[3];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[1];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_40;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_28;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + auStack_98[2];
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_70;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_48;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_78;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + auStack_98[0];
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_20;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_58;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_50;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + auStack_98[0];
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_70;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_60;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + auStack_98[2];
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_78;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_20;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_28;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + auStack_98[1];
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_40;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_38;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_68;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_58;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + auStack_98[3];
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + auStack_98[2];
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_38;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_68;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_48;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + auStack_98[0];
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_40;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_58;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + auStack_98[3];
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_78;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_30;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_60;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_70;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_20;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_28;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + auStack_98[1];
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_50;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_38;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_70;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[1];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_20;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_28;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_78;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + auStack_98[0];
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_60;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_68;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + auStack_98[3];
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_50;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + auStack_98[2];
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_58;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_40;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_30;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_40;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_60;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_28;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + auStack_98[1];
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + auStack_98[3];
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_70;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + auStack_98[0];
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_20;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_78;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_58;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_68;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + auStack_98[2];
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_48;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_68;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_20;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_28;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_50;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_40;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + auStack_98[3];
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + auStack_98[0];
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_58;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_38;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + auStack_98[2];
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_30;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_60;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + auStack_98[1];
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_78;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_48;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_70;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_48;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + auStack_98[2];
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_58;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_78;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_60;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_68;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + auStack_98[1];
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_70;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_20;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_40;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_50;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_28;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + auStack_98[3];
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_38;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + auStack_98[0];
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + auStack_98[0];
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + auStack_98[1];
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[2];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + auStack_98[3];
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_78;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_70;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_60;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + lStack_58;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + lStack_48;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + lStack_40;
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_38;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_30;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_28;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + lStack_20;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + lStack_28;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + lStack_48;
  local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = rotr64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + lStack_78;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + lStack_58;
  local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = rotr64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + lStack_50;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + lStack_20;
  local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = rotr64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + lStack_30;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = rotr64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + auStack_98[1];
  local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + lStack_38;
  local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = rotr64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + auStack_98[0];
  local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + auStack_98[2];
  local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = rotr64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + lStack_40;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + lStack_60;
  local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = rotr64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + lStack_70;
  local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + auStack_98[3];
  local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = rotr64(local_118[4] ^ local_d0,0x3f);
  for (local_11c = 0; local_11c < 8; local_11c = local_11c + 1) {
    *(ulong *)(local_8 + (long)local_11c * 8) =
         *(ulong *)(local_8 + (long)local_11c * 8) ^ local_118[local_11c] ^ local_118[local_11c + 8]
    ;
  }
  return 0;
}

Assistant:

static int blake2b_compress( blake2b_state *S, const uint8_t block[BLAKE2B_BLOCKBYTES] )
{
  uint64_t m[16];
  uint64_t v[16];
  int i;

  for( i = 0; i < 16; ++i )
    m[i] = load64( block + i * sizeof( m[i] ) );

  for( i = 0; i < 8; ++i )
    v[i] = S->h[i];

  v[ 8] = blake2b_IV[0];
  v[ 9] = blake2b_IV[1];
  v[10] = blake2b_IV[2];
  v[11] = blake2b_IV[3];
  v[12] = S->t[0] ^ blake2b_IV[4];
  v[13] = S->t[1] ^ blake2b_IV[5];
  v[14] = S->f[0] ^ blake2b_IV[6];
  v[15] = S->f[1] ^ blake2b_IV[7];
#define G(r,i,a,b,c,d) \
  do { \
    a = a + b + m[blake2b_sigma[r][2*i+0]]; \
    d = rotr64(d ^ a, 32); \
    c = c + d; \
    b = rotr64(b ^ c, 24); \
    a = a + b + m[blake2b_sigma[r][2*i+1]]; \
    d = rotr64(d ^ a, 16); \
    c = c + d; \
    b = rotr64(b ^ c, 63); \
  } while(0)
#define ROUND(r)  \
  do { \
    G(r,0,v[ 0],v[ 4],v[ 8],v[12]); \
    G(r,1,v[ 1],v[ 5],v[ 9],v[13]); \
    G(r,2,v[ 2],v[ 6],v[10],v[14]); \
    G(r,3,v[ 3],v[ 7],v[11],v[15]); \
    G(r,4,v[ 0],v[ 5],v[10],v[15]); \
    G(r,5,v[ 1],v[ 6],v[11],v[12]); \
    G(r,6,v[ 2],v[ 7],v[ 8],v[13]); \
    G(r,7,v[ 3],v[ 4],v[ 9],v[14]); \
  } while(0)
  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );
  ROUND( 10 );
  ROUND( 11 );

  for( i = 0; i < 8; ++i )
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];

#undef G
#undef ROUND
  return 0;
}